

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O0

void test_4(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChStreamOutAscii *pCVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  ChVector<double> *pCVar9;
  ChVector<double> local_8e8;
  ChVector<double> local_8d0;
  ChVector<double> local_8b8;
  ChVector<double> local_8a0;
  ChVector<double> local_888;
  ChVector<double> local_870;
  ChVector<double> local_858;
  ChVector<double> local_840;
  shared_ptr<chrono::ChSolver> local_828;
  undefined1 local_818 [8];
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::ChPhysicsItem> local_7f8;
  shared_ptr<chrono::ChPhysicsItem> local_7e8;
  shared_ptr<chrono::ChPhysicsItem> local_7d8;
  shared_ptr<chrono::ChBodyFrame> local_7c8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_7b8;
  shared_ptr<chrono::ChBodyFrame> local_7a8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_798;
  shared_ptr<chrono::ChBodyFrame> local_788;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_778;
  shared_ptr<chrono::ChBodyFrame> local_768;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_758;
  undefined1 local_748 [8];
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint4;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  undefined1 local_6f8 [8];
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChElementBase> local_6d8;
  shared_ptr<chrono::fea::ChContinuumElastic> local_6c8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_6b8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_6a8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_698;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_688;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_678;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_668;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_658;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_648;
  undefined1 local_638 [8];
  shared_ptr<chrono::fea::ChElementHexaCorot_8> melement1;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_618;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_608;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_5f8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_5e8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_5d8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_5c8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_5b8;
  ChVector<double> local_5a8;
  ChVector<double> local_590;
  ChVector<double> local_578;
  ChVector<double> local_560;
  ChVector<double> local_548;
  undefined1 local_530 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode8;
  undefined1 local_508 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode7;
  undefined1 local_4e0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode6;
  undefined1 local_4b8 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode5;
  undefined1 local_490 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  undefined1 local_468 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  undefined1 local_440 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  undefined1 local_418 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  double sz;
  double sy;
  double sx;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  undefined1 local_3d0 [8];
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  ChSystemSMC sys;
  
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar2,"\n-------------------------------------------------\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"TEST: LINEAR hexahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,true);
  chrono_types::make_shared<chrono::fea::ChMesh,_0>();
  chrono_types::make_shared<chrono::fea::ChContinuumElastic,_0>();
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&sx);
  chrono::fea::ChContinuumElastic::Set_E(207000000.0);
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&sx);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f847ae147ae147b;
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_418);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_440);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.01,0.0,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_468);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.01,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_490);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.1,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_4b8);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.1,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_4e0);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.01,0.1,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_508);
  chrono::ChVector<double>::ChVector(&local_548,0.01,0.1,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_530);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4b8);
  chrono::ChVector<double>::ChVector(&local_560,0.0,-1000.0,0.0);
  (**(code **)(*(long *)peVar3 + 0x68))(peVar3,&local_560);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4e0);
  chrono::ChVector<double>::ChVector(&local_578,0.0,-1000.0,0.0);
  (**(code **)(*(long *)peVar3 + 0x68))(peVar3,&local_578);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_508);
  chrono::ChVector<double>::ChVector(&local_590,0.0,-1000.0,0.0);
  (**(code **)(*(long *)peVar3 + 0x68))(peVar3,&local_590);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_530);
  chrono::ChVector<double>::ChVector(&local_5a8,0.0,-1000.0,0.0);
  (**(code **)(*(long *)peVar3 + 0x68))(peVar3,&local_5a8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_5b8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  chrono::fea::ChMesh::AddNode(peVar4,&local_5b8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_5b8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_5c8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_440);
  chrono::fea::ChMesh::AddNode(peVar4,&local_5c8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_5c8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_5d8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  chrono::fea::ChMesh::AddNode(peVar4,&local_5d8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_5d8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_5e8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_490);
  chrono::fea::ChMesh::AddNode(peVar4,&local_5e8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_5e8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_5f8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4b8);
  chrono::fea::ChMesh::AddNode(peVar4,&local_5f8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_5f8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_608,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4e0);
  chrono::fea::ChMesh::AddNode(peVar4,&local_608);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_608);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_618,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_508);
  chrono::fea::ChMesh::AddNode(peVar4,&local_618);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_618);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  p_Var1 = &melement1.
            super___shared_ptr<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)p_Var1,
             (shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_530);
  chrono::fea::ChMesh::AddNode(peVar4,p_Var1);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)
             &melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::fea::ChElementHexaCorot_8,_0>();
  peVar5 = std::
           __shared_ptr_access<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_638);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_648,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_658,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_440);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_668,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_678,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_490);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_688,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4b8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_698,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4e0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_6a8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_508);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_6b8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_530);
  (**(code **)(*(long *)peVar5 + 0x38))
            (peVar5,&local_648,&local_658,&local_668,&local_678,&local_688,&local_698,&local_6a8,
             &local_6b8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_6b8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_6a8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_698);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_688);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_678);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_668);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_658);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_648);
  peVar5 = std::
           __shared_ptr_access<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_638);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::shared_ptr
            (&local_6c8,(shared_ptr<chrono::fea::ChContinuumElastic> *)&sx);
  chrono::fea::ChElementHexaCorot_8::SetMaterial(peVar5,&local_6c8);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr(&local_6c8);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3d0);
  std::shared_ptr<chrono::fea::ChElementBase>::shared_ptr<chrono::fea::ChElementHexaCorot_8,void>
            (&local_6d8,(shared_ptr<chrono::fea::ChElementHexaCorot_8> *)local_638);
  chrono::fea::ChMesh::AddElement(peVar4,&local_6d8);
  std::shared_ptr<chrono::fea::ChElementBase>::~shared_ptr(&local_6d8);
  p_Var1 = &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChMesh,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChMesh> *)local_3d0);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono_types::make_shared<chrono::ChBody,_0>();
  p_Var1 = &constraint1.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBody,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,(shared_ptr<chrono::ChBody> *)local_6f8);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar6 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_6f8);
  chrono::ChBody::SetBodyFixed(SUB81(peVar6,0));
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint2.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_758,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_768,(shared_ptr<chrono::ChBody> *)local_6f8);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_758,&local_768,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_768);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_758);
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint3.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_778,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_440);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_788,(shared_ptr<chrono::ChBody> *)local_6f8);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_778,&local_788,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_788);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_778);
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&constraint4.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_798,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_7a8,(shared_ptr<chrono::ChBody> *)local_6f8);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_798,&local_7a8,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_7a8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_798);
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_748);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_7b8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_490);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_7c8,(shared_ptr<chrono::ChBody> *)local_6f8);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_7b8,&local_7c8,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_7c8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_7b8);
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (&local_7d8,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_7d8);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_7d8);
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (&local_7e8,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_7e8);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_7e8);
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (&local_7f8,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_7f8);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_7f8);
  p_Var1 = &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)local_748);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::ChSolverMINRES,_0>();
  std::shared_ptr<chrono::ChSolver>::shared_ptr<chrono::ChSolverMINRES,void>
            (&local_828,(shared_ptr<chrono::ChSolverMINRES> *)local_818);
  chrono::ChSystem::SetSolver
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_828);
  std::shared_ptr<chrono::ChSolver>::~shared_ptr(&local_828);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_818);
  chrono::ChIterativeSolver::SetMaxIterations((ChIterativeSolver *)peVar8,100);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_818);
  chrono::ChIterativeSolver::SetTolerance((ChIterativeSolver *)peVar8,1e-12);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_818);
  chrono::ChIterativeSolver::EnableDiagonalPreconditioner((ChIterativeSolver *)peVar8,true);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_818);
  chrono::ChSolver::SetVerbose((ChSolver *)(peVar8 + 0x18),true);
  chrono::ChSystem::DoStaticLinear();
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_418);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar9);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_440);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar9);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_468);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar9);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_490);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  pCVar2 = chrono::operator<<(pCVar2,pCVar9);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node5 displ: ");
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4b8);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4b8);
  (**(code **)(*(long *)peVar3 + 0x60))(&local_858);
  chrono::ChVector<double>::operator-(&local_840,pCVar9,&local_858);
  pCVar2 = chrono::operator<<(pCVar2,&local_840);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node6 displ: ");
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4e0);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4e0);
  (**(code **)(*(long *)peVar3 + 0x60))(&local_888);
  chrono::ChVector<double>::operator-(&local_870,pCVar9,&local_888);
  pCVar2 = chrono::operator<<(pCVar2,&local_870);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node7 displ: ");
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_508);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_508);
  (**(code **)(*(long *)peVar3 + 0x60))(&local_8b8);
  chrono::ChVector<double>::operator-(&local_8a0,pCVar9,&local_8b8);
  pCVar2 = chrono::operator<<(pCVar2,&local_8a0);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node8 displ: ");
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_530);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_530);
  (**(code **)(*(long *)peVar3 + 0x60))(&local_8e8);
  chrono::ChVector<double>::operator-(&local_8d0,pCVar9,&local_8e8);
  pCVar2 = chrono::operator<<(pCVar2,&local_8d0);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  std::shared_ptr<chrono::ChSolverMINRES>::~shared_ptr
            ((shared_ptr<chrono::ChSolverMINRES> *)local_818);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)local_748);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)local_6f8);
  std::shared_ptr<chrono::fea::ChElementHexaCorot_8>::~shared_ptr
            ((shared_ptr<chrono::fea::ChElementHexaCorot_8> *)local_638);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_530);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_508);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4e0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4b8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_490);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_468);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_440);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_418);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr
            ((shared_ptr<chrono::fea::ChContinuumElastic> *)&sx);
  std::shared_ptr<chrono::fea::ChMesh>::~shared_ptr((shared_ptr<chrono::fea::ChMesh> *)local_3d0);
  chrono::ChSystemSMC::~ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void test_4() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: LINEAR hexahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(207e6);
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    double sx = 0.01;
    double sy = 0.10;
    double sz = 0.01;
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, sz));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, sz));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, 0));
    auto mnode5 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, 0));
    auto mnode6 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, sz));
    auto mnode7 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, sz));
    auto mnode8 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, 0));

    // For example, set applied forces to nodes:
    mnode5->SetForce(ChVector<>(0, -1000, 0));
    mnode6->SetForce(ChVector<>(0, -1000, 0));
    mnode7->SetForce(ChVector<>(0, -1000, 0));
    mnode8->SetForce(ChVector<>(0, -1000, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);
    my_mesh->AddNode(mnode5);
    my_mesh->AddNode(mnode6);
    my_mesh->AddNode(mnode7);
    my_mesh->AddNode(mnode8);

    // Create the tetrahedron element, and assign
    // it nodes and material
    auto melement1 = chrono_types::make_shared<ChElementHexaCorot_8>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4, mnode5, mnode6, mnode7, mnode8);
    melement1->SetMaterial(mmaterial);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    sys.Add(truss);
    truss->SetBodyFixed(true);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint4 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,   // node
                            truss);   // body to be connected to

    constraint3->Initialize(mnode3,   // node
                            truss);   // body to be connected to

    constraint4->Initialize(mnode4,   // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);
    sys.Add(constraint4);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-12);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    // GetLog()<<melement1.GetStiffnessMatrix()<<"\n";
    // GetLog()<<melement1.GetMatrB()<<"\n";
    GetLog() << mnode1->GetPos() << "\n";
    GetLog() << mnode2->GetPos() << "\n";
    GetLog() << mnode3->GetPos() << "\n";
    GetLog() << mnode4->GetPos() << "\n";
    GetLog() << "node5 displ: " << mnode5->GetPos() - mnode5->GetX0() << "\n";
    GetLog() << "node6 displ: " << mnode6->GetPos() - mnode6->GetX0() << "\n";
    GetLog() << "node7 displ: " << mnode7->GetPos() - mnode7->GetX0() << "\n";
    GetLog() << "node8 displ: " << mnode8->GetPos() - mnode8->GetX0() << "\n";
}